

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void TypeCheck_MethodCall(KonohaContext *kctx,KonohaStack *sfp)

{
  kNameSpace *node;
  kNameSpace *pkVar1;
  kNode *pkVar2;
  KonohaStack *in_RSI;
  KonohaContext *in_RDI;
  kMethod *mtd;
  kNode *texpr;
  KClass *reqc;
  kNameSpace *ns;
  kNode *expr;
  KonohaContext *in_stack_00000048;
  KClass *in_stack_000000b0;
  kNameSpace *in_stack_000000b8;
  kNode *in_stack_000000c0;
  kMethod *in_stack_000000c8;
  KonohaContext *in_stack_000000d0;
  kMethod *local_40;
  kMethod *local_38;
  kNode *local_30;
  
  node = in_RSI[1].field_0.asNameSpace;
  pkVar1 = kNode_GetNameSpace(in_RDI,(kNode *)node);
  (*(in_RDI->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f3,"tracing..");
  local_30 = *(kNode **)((*in_RDI->runtimeModels)[1].freeModel + 0xc0);
  (*in_RDI->klib->DumpObject)
            (in_RDI,(kObject_conflict *)node,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f5);
  if (((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&node->importedNameSpaceList)->NodeList->h).ct)->
      baseTypeId != 6) {
    __assert_fail("((((expr->NodeList)->h.ct)->baseTypeId) == KType_Array)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f6,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  local_38 = (kMethod *)
             *(((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&node->importedNameSpaceList)->NodeList->
              field_2).ObjectItems;
  if (local_38 != (kMethod *)0x0) {
    if (((local_38->h).ct)->baseTypeId != 8) {
      local_30 = (*in_RDI->klib->TypeCheckNodeAt)
                           (in_RDI,(kNode *)node,1,pkVar1,
                            (KClass *)
                            (((in_RDI->share->classTable).field_1.keyValueItems)->field_2).
                            ObjectValue,0);
      if (local_30->nodeType == 0x18) {
        local_40 = (kMethod *)0x0;
      }
      else {
        local_40 = LookupMethod(in_stack_00000048,(kNode *)kctx,(kNameSpace *)sfp);
      }
      local_38 = local_40;
    }
    if (local_38 == (kMethod *)0x0) {
      if (local_30->nodeType == 0x18) {
        in_RSI[-4].field_0.asNode = local_30;
        (*in_RDI->klib->CheckSafePoint)(in_RDI,in_RSI,0);
      }
      else {
        in_RSI[-4].field_0.asNameSpace = node;
        (*in_RDI->klib->CheckSafePoint)(in_RDI,in_RSI,0);
      }
    }
    else {
      pkVar2 = TypeCheckMethodParam
                         (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                          in_stack_000000b0);
      in_RSI[-4].field_0.asNode = pkVar2;
      (*in_RDI->klib->CheckSafePoint)(in_RDI,in_RSI,0);
    }
    return;
  }
  __assert_fail("mtd != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                ,0x2f8,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
}

Assistant:

static KMETHOD TypeCheck_MethodCall(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(expr, ns, reqc);
	kNode *texpr = K_NULLNODE;
	KDump(expr);
	DBG_ASSERT(IS_Array(expr->NodeList));
	kMethod *mtd = expr->NodeList->MethodItems[0];
	DBG_ASSERT(mtd != NULL);
	if(!IS_Method(mtd)) {
		texpr = KLIB TypeCheckNodeAt(kctx, expr, 1, ns, KClass_INFER, 0);
		mtd = (kNode_IsError(texpr)) ? NULL : LookupMethod(kctx, expr, ns);
	}
	if(mtd != NULL) {
		texpr = TypeCheckMethodParam(kctx, mtd, expr, ns, reqc);
		KReturn(texpr);
	}
	if(kNode_IsError(texpr)) {
		KReturn(texpr);
	}
	KReturn(expr);
}